

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen7Texture.cpp
# Opt level: O0

GMM_STATUS __thiscall
GmmLib::GmmGen7TextureCalc::FillTex2D
          (GmmGen7TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,__GMM_BUFFER_TYPE *pRestrictions)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  uint8_t uVar27;
  int iVar28;
  int iVar29;
  uint local_f4;
  uint local_f0;
  uint32_t local_ec;
  uint32_t local_e8;
  uint32_t local_dc;
  uint32_t local_d0;
  uint32_t local_c4;
  uint32_t local_b8;
  bool local_ab;
  bool local_aa;
  bool local_a9;
  int local_a8;
  int local_a0;
  undefined4 local_9c;
  uint32_t TRTileHeight;
  uint32_t TRTileWidth;
  uint32_t RowFactor;
  uint32_t ColFactor;
  uint32_t AlignedWidthLod2;
  uint32_t AlignedWidthLod1;
  uint32_t Height1;
  uint32_t Height0;
  bool csRestrictionsMet;
  GMM_PLATFORM_INFO *pPlatform;
  GMM_STATUS Status;
  uint uStack_54;
  uint8_t Compress;
  uint32_t Pitch;
  uint32_t ExpandedArraySize;
  uint32_t BlockHeight;
  uint32_t AlignedWidth;
  uint32_t CompressDepth;
  uint32_t CompressWidth;
  uint32_t CompressHeight;
  uint32_t VAlign;
  uint32_t HAlign;
  uint32_t BitsPerPixel;
  uint32_t Height;
  uint32_t Width;
  __GMM_BUFFER_TYPE *pRestrictions_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmGen7TextureCalc *this_local;
  
  pPlatform._7_1_ = 0;
  if (pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    this_local._4_4_ = GMM_ERROR;
  }
  else if (pRestrictions == (__GMM_BUFFER_TYPE *)0x0) {
    this_local._4_4_ = GMM_ERROR;
  }
  else {
    _Height = pRestrictions;
    pRestrictions_local = (__GMM_BUFFER_TYPE *)pTexInfo;
    pTexInfo_local = (GMM_TEXTURE_INFO *)this;
    _Height0 = GmmGetPlatformInfo((this->super_GmmTextureCalc).pGmmLibContext);
    VAlign = pRestrictions_local->RenderPitchAlignment;
    HAlign = pRestrictions_local->MinHeight;
    uVar1 = pRestrictions_local->MinAllocationSize;
    BitsPerPixel = (uint32_t)uVar1;
    if (*(uint *)((long)&pRestrictions_local->MaxHeight + 4) < 2) {
      local_9c = 1;
    }
    else {
      local_9c = *(undefined4 *)((long)&pRestrictions_local->MaxHeight + 4);
    }
    *(undefined4 *)((long)&pRestrictions_local->MaxHeight + 4) = local_9c;
    if (*(uint *)((long)&pRestrictions_local->MinWidth + 4) < 2) {
      local_a0 = 1;
    }
    else {
      local_a0 = *(int *)((long)&pRestrictions_local->MinWidth + 4);
    }
    iVar28 = 1;
    if (pRestrictions_local->Alignment == 4) {
      iVar28 = 6;
    }
    uVar2._0_4_ = pRestrictions_local->LockPitchAlignment;
    uVar2._4_4_ = pRestrictions_local->MinPitch;
    if (((uVar2 >> 6 & 1) == 0) &&
       (uVar3._0_4_ = pRestrictions_local->LockPitchAlignment,
       uVar3._4_4_ = pRestrictions_local->MinPitch, (uVar3 >> 0x1d & 1) == 0)) {
      local_a8 = *(int *)((long)&pRestrictions_local->MaxHeight + 4);
    }
    else {
      local_a8 = 1;
    }
    uStack_54 = local_a0 * iVar28 * local_a8;
    uVar4._0_4_ = pRestrictions_local->LockPitchAlignment;
    uVar4._4_4_ = pRestrictions_local->MinPitch;
    if (((uVar4 >> 3 & 1) != 0) ||
       (uVar5._0_4_ = pRestrictions_local->LockPitchAlignment,
       uVar5._4_4_ = pRestrictions_local->MinPitch, (uVar5 >> 4 & 1) != 0)) {
      local_a9 = false;
      if (((uStack_54 < 3) &&
          (local_a9 = false, uStack_54 == *(uint *)((long)&pRestrictions_local->MinWidth + 4))) &&
         ((((pRestrictions_local->PitchAlignment == 0x7e ||
            (pRestrictions_local->PitchAlignment == 0x7f)) ||
           (pRestrictions_local->PitchAlignment == 0x17)) ||
          (((pRestrictions_local->PitchAlignment == 0x18 ||
            (pRestrictions_local->PitchAlignment == 0x19)) ||
           (local_a9 = false, pRestrictions_local->PitchAlignment == 0x1a)))))) {
        uVar6._0_4_ = pRestrictions_local->LockPitchAlignment;
        uVar6._4_4_ = pRestrictions_local->MinPitch;
        if (((uVar6 >> 3 & 1) == 0) || (local_aa = true, (uVar1 & 0xf) != 0)) {
          uVar1._0_4_ = pRestrictions_local->LockPitchAlignment;
          uVar1._4_4_ = pRestrictions_local->MinPitch;
          local_ab = (uVar1 >> 4 & 1) != 0 && BitsPerPixel % 0xc == 0;
          local_aa = local_ab;
        }
        local_a9 = local_aa;
      }
      Height1._3_1_ = local_a9;
      if (local_a9 == false) {
        uVar7._0_4_ = pRestrictions_local->LockPitchAlignment;
        uVar7._4_4_ = pRestrictions_local->MinPitch;
        pRestrictions_local->LockPitchAlignment = (int)(uVar7 & 0xfffffffffffffff7);
        pRestrictions_local->MinPitch = (int)((uVar7 & 0xfffffffffffffff7) >> 0x20);
        uVar8._0_4_ = pRestrictions_local->LockPitchAlignment;
        uVar8._4_4_ = pRestrictions_local->MinPitch;
        pRestrictions_local->LockPitchAlignment = (int)(uVar8 & 0xffffffffffffffef);
        pRestrictions_local->MinPitch = (int)((uVar8 & 0xffffffffffffffef) >> 0x20);
      }
      else {
        uStack_54 = 4;
      }
    }
    CompressHeight = pRestrictions_local->MaxDepth;
    CompressWidth = pRestrictions_local->MaxArraySize;
    GmmTextureCalc::GetCompressionBlockDimensions
              (&this->super_GmmTextureCalc,pRestrictions_local->PitchAlignment,&AlignedWidth,
               &CompressDepth,&BlockHeight);
    pPlatform._7_1_ =
         GmmIsCompressed((this->super_GmmTextureCalc).pGmmLibContext,
                         pRestrictions_local->PitchAlignment);
    if (uStack_54 < 2) {
      Pitch = (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[6])(this,pRestrictions_local);
    }
    else {
      uVar9._0_4_ = pRestrictions_local->LockPitchAlignment;
      uVar9._4_4_ = pRestrictions_local->MinPitch;
      if (((uVar9 >> 6 & 1) == 0) &&
         (uVar10._0_4_ = pRestrictions_local->LockPitchAlignment,
         uVar10._4_4_ = pRestrictions_local->MinPitch, (uVar10 >> 0x1d & 1) == 0)) {
        local_b8 = 1;
      }
      else {
        local_b8 = *(uint32_t *)((long)&pRestrictions_local->MaxHeight + 4);
      }
      AlignedWidthLod1 =
           GmmTextureCalc::ExpandHeight(&this->super_GmmTextureCalc,HAlign,CompressWidth,local_b8);
      if (((((int)pRestrictions_local->MinWidth == 0) &&
           (uVar11._0_4_ = pRestrictions_local->LockPitchAlignment,
           uVar11._4_4_ = pRestrictions_local->MinPitch, (uVar11 >> 6 & 1) == 0)) &&
          (uVar12._0_4_ = pRestrictions_local->LockPitchAlignment,
          uVar12._4_4_ = pRestrictions_local->MinPitch, (uVar12 >> 10 & 1) == 0)) &&
         (uVar13._0_4_ = pRestrictions_local->LockPitchAlignment,
         uVar13._4_4_ = pRestrictions_local->MinPitch, (uVar13 >> 0x1d & 1) == 0)) {
        *(undefined1 *)&pRestrictions_local->MaxWidth = 1;
        Pitch = AlignedWidthLod1;
      }
      else {
        uVar14._0_4_ = pRestrictions_local->LockPitchAlignment;
        uVar14._4_4_ = pRestrictions_local->MinPitch;
        if (((uVar14 >> 6 & 1) == 0) &&
           (uVar15._0_4_ = pRestrictions_local->LockPitchAlignment,
           uVar15._4_4_ = pRestrictions_local->MinPitch, (uVar15 >> 0x1d & 1) == 0)) {
          local_c4 = 1;
        }
        else {
          local_c4 = *(uint32_t *)((long)&pRestrictions_local->MaxHeight + 4);
        }
        AlignedWidthLod2 =
             GmmTextureCalc::ExpandHeight
                       (&this->super_GmmTextureCalc,HAlign >> 1,CompressWidth,local_c4);
        Pitch = AlignedWidthLod1 + AlignedWidthLod2 + CompressWidth * 0xc;
      }
      if (pPlatform._7_1_ == '\0') {
        uVar16._0_4_ = pRestrictions_local->LockPitchAlignment;
        uVar16._4_4_ = pRestrictions_local->MinPitch;
        if ((uVar16 >> 0x1d & 1) != 0) {
          Pitch = Pitch >> 1;
        }
      }
      else {
        Pitch = Pitch / CompressDepth;
      }
      Pitch = uStack_54 * Pitch;
    }
    uVar17._0_4_ = pRestrictions_local->LockPitchAlignment;
    uVar17._4_4_ = pRestrictions_local->MinPitch;
    if (((uVar17 >> 6 & 1) == 0) &&
       (uVar18._0_4_ = pRestrictions_local->LockPitchAlignment,
       uVar18._4_4_ = pRestrictions_local->MinPitch, (uVar18 >> 0x1d & 1) == 0)) {
      local_d0 = 1;
    }
    else {
      local_d0 = *(uint32_t *)((long)&pRestrictions_local->MaxHeight + 4);
    }
    ExpandedArraySize =
         GmmTextureCalc::ExpandWidth
                   (&this->super_GmmTextureCalc,BitsPerPixel,CompressHeight,local_d0);
    if (1 < (uint)pRestrictions_local->MinWidth) {
      uVar19._0_4_ = pRestrictions_local->LockPitchAlignment;
      uVar19._4_4_ = pRestrictions_local->MinPitch;
      if (((uVar19 >> 6 & 1) == 0) &&
         (uVar20._0_4_ = pRestrictions_local->LockPitchAlignment,
         uVar20._4_4_ = pRestrictions_local->MinPitch, (uVar20 >> 0x1d & 1) == 0)) {
        local_dc = 1;
      }
      else {
        local_dc = *(uint32_t *)((long)&pRestrictions_local->MaxHeight + 4);
      }
      ColFactor = GmmTextureCalc::ExpandWidth
                            (&this->super_GmmTextureCalc,BitsPerPixel >> 1,CompressHeight,local_dc);
      uVar21._0_4_ = pRestrictions_local->LockPitchAlignment;
      uVar21._4_4_ = pRestrictions_local->MinPitch;
      if (((uVar21 >> 6 & 1) == 0) &&
         (uVar22._0_4_ = pRestrictions_local->LockPitchAlignment,
         uVar22._4_4_ = pRestrictions_local->MinPitch, (uVar22 >> 0x1d & 1) == 0)) {
        local_e8 = 1;
      }
      else {
        local_e8 = *(uint32_t *)((long)&pRestrictions_local->MaxHeight + 4);
      }
      RowFactor = GmmTextureCalc::ExpandWidth
                            (&this->super_GmmTextureCalc,BitsPerPixel >> 2,CompressHeight,local_e8);
      if (ColFactor + RowFactor < ExpandedArraySize) {
        local_ec = ExpandedArraySize;
      }
      else {
        local_ec = ColFactor + RowFactor;
      }
      ExpandedArraySize = local_ec;
    }
    if (pPlatform._7_1_ == '\0') {
      uVar23._0_4_ = pRestrictions_local->LockPitchAlignment;
      uVar23._4_4_ = pRestrictions_local->MinPitch;
      if ((uVar23 >> 0x1d & 1) == 0) {
        uVar24._0_4_ = pRestrictions_local->LockPitchAlignment;
        uVar24._4_4_ = pRestrictions_local->MinPitch;
        if ((uVar24 >> 3 & 1) == 0) {
          uVar25._0_4_ = pRestrictions_local->LockPitchAlignment;
          uVar25._4_4_ = pRestrictions_local->MinPitch;
          if ((uVar25 >> 4 & 1) != 0) {
            ExpandedArraySize =
                 (*(int *)((long)&pRestrictions_local->MinWidth + 4) * ExpandedArraySize) / 3;
          }
        }
        else {
          ExpandedArraySize =
               *(int *)((long)&pRestrictions_local->MinWidth + 4) * ExpandedArraySize >> 2;
        }
      }
      else {
        ExpandedArraySize = ExpandedArraySize << 1;
      }
    }
    else {
      ExpandedArraySize = ExpandedArraySize / AlignedWidth;
    }
    local_f0 = ExpandedArraySize * VAlign >> 3;
    if (local_f0 <= _Height->MinPitch) {
      local_f0 = _Height->MinPitch;
    }
    Status = (local_f0 + (_Height->PitchAlignment - 1)) -
             (local_f0 + (_Height->PitchAlignment - 1) & _Height->PitchAlignment - 1);
    if (_Height0->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalSize != 0) {
      Status = (Status + (_Height0->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileWidth
                         - 1)) -
               (Status + (_Height0->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileWidth
                         - 1) &
               _Height0->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileWidth - 1);
      Pitch = (Pitch + (_Height0->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileHeight
                       - 1)) -
              (Pitch + (_Height0->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileHeight
                       - 1) &
              _Height0->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileHeight - 1);
      uVar26._0_4_ = pRestrictions_local->LockPitchAlignment;
      uVar26._4_4_ = pRestrictions_local->MinPitch;
      if ((((uVar26 >> 0x23 & 1) != 0) ||
          ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x1b & 1) != 0)) &&
         ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x24 & 1) != 0)) {
        TRTileWidth = 0;
        TRTileHeight = 0;
        GmmTextureCalc::GmmGetD3DToHwTileConversion
                  (&this->super_GmmTextureCalc,(GMM_TEXTURE_INFO *)pRestrictions_local,&TRTileWidth,
                   &TRTileHeight);
        iVar28 = _Height0->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileWidth *
                 TRTileWidth;
        iVar29 = _Height0->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileHeight *
                 TRTileHeight;
        Status = (Status + iVar28 + -1) - (Status + iVar28 + -1 & iVar28 - 1U);
        Pitch = (Pitch + iVar29 + -1) - (Pitch + iVar29 + -1 & iVar29 - 1U);
      }
    }
    *(ulong *)&pRestrictions_local->field_0x14 =
         *(ulong *)&pRestrictions_local->field_0x14 & 0xffffffffffff7fff | 0x8000;
    *(ulong *)&pRestrictions_local->field_0x14 =
         *(ulong *)&pRestrictions_local->field_0x14 & 0xfffffffffffdffff;
    uVar27 = GmmIsYUVPacked(pRestrictions_local->PitchAlignment);
    if (((uVar27 != '\0') || (pRestrictions_local->RenderPitchAlignment == 0x60)) ||
       (pRestrictions_local->RenderPitchAlignment == 0x30)) {
      if (Status == GMM_SUCCESS) {
        local_f4 = 0x10;
      }
      else {
        local_f4 = (Status + 0xf) / Status;
      }
      Pitch = local_f4 + 1 + Pitch;
    }
    Pitch = (Pitch + 1) - (Pitch + 1 & 1);
    pPlatform._0_4_ =
         GmmTextureCalc::FillTexPitchAndSize
                   (&this->super_GmmTextureCalc,(GMM_TEXTURE_INFO *)pRestrictions_local,
                    (ulong)Status,Pitch,_Height);
    if ((GMM_STATUS)pPlatform == GMM_SUCCESS) {
      (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[7])(this,pRestrictions_local);
      pRestrictions_local[1].Alignment = 0xf;
    }
    this_local._4_4_ = (GMM_STATUS)pPlatform;
  }
  return this_local._4_4_;
}

Assistant:

GMM_STATUS GMM_STDCALL GmmLib::GmmGen7TextureCalc::FillTex2D(GMM_TEXTURE_INFO * pTexInfo,
                                                             __GMM_BUFFER_TYPE *pRestrictions)
{
    uint32_t   Width, Height, BitsPerPixel;
    uint32_t   HAlign, VAlign;
    uint32_t   CompressHeight, CompressWidth, CompressDepth;
    uint32_t   AlignedWidth, BlockHeight, ExpandedArraySize, Pitch;
    uint8_t    Compress = 0;
    GMM_STATUS Status;

    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pRestrictions, GMM_ERROR);

    GMM_DPF_ENTER;

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    BitsPerPixel = pTexInfo->BitsPerPixel;
    Height       = pTexInfo->BaseHeight;
    Width        = GFX_ULONG_CAST(pTexInfo->BaseWidth);

    pTexInfo->MSAA.NumSamples = GFX_MAX(pTexInfo->MSAA.NumSamples, 1);

    ExpandedArraySize =
    GFX_MAX(pTexInfo->ArraySize, 1) *
    ((pTexInfo->Type == RESOURCE_CUBE) ? 6 : 1) * // Cubemaps simply 6-element, 2D arrays.
    ((pTexInfo->Flags.Gpu.Depth || pTexInfo->Flags.Gpu.SeparateStencil) ?
     1 :
     pTexInfo->MSAA.NumSamples); // Gen7 MSAA (non-Depth/Stencil) RT samples stored as array planes.

    //
    // Check for color separation
    //
    if(pTexInfo->Flags.Gpu.ColorSeparation || pTexInfo->Flags.Gpu.ColorSeparationRGBX)
    {
        bool csRestrictionsMet = (((ExpandedArraySize <= 2) &&
                                   (ExpandedArraySize == pTexInfo->ArraySize) &&
                                   ((pTexInfo->Format == GMM_FORMAT_R8G8B8A8_UNORM) ||
                                    (pTexInfo->Format == GMM_FORMAT_R8G8B8A8_UNORM_SRGB) ||
                                    (pTexInfo->Format == GMM_FORMAT_B8G8R8A8_UNORM) ||
                                    (pTexInfo->Format == GMM_FORMAT_B8G8R8A8_UNORM_SRGB) ||
                                    (pTexInfo->Format == GMM_FORMAT_B8G8R8X8_UNORM) ||
                                    (pTexInfo->Format == GMM_FORMAT_B8G8R8X8_UNORM_SRGB)) &&
                                   ((pTexInfo->Flags.Gpu.ColorSeparation && (Width % 16) == 0) ||
                                    (pTexInfo->Flags.Gpu.ColorSeparationRGBX && (Width % 12) == 0))));

        if(csRestrictionsMet)
        {
            ExpandedArraySize = GMM_COLOR_SEPARATION_ARRAY_SIZE;
        }
        else
        {
            pTexInfo->Flags.Gpu.ColorSeparation     = 0;
            pTexInfo->Flags.Gpu.ColorSeparationRGBX = 0;
        }
    }

    HAlign = pTexInfo->Alignment.HAlign;
    VAlign = pTexInfo->Alignment.VAlign;
    GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

    Compress = GmmIsCompressed(pGmmLibContext, pTexInfo->Format);

    /////////////////////////////////
    // Calculate Block Surface Height
    /////////////////////////////////

    // Adjust total height for arrayed 2D textures
    if(ExpandedArraySize > 1)
    {
        uint32_t Height0, Height1;

        Height0 = __GMM_EXPAND_HEIGHT(this, Height, VAlign, pTexInfo);

        // If not ARYSPC_LOD0-eligible...
        if((pTexInfo->MaxLod > 0) ||
           pTexInfo->Flags.Gpu.Depth || // Depth/HiZ/Stencil buffers not ARYSPC_LOD0-compatible.
           pTexInfo->Flags.Gpu.HiZ ||
           pTexInfo->Flags.Gpu.SeparateStencil)
        {
            Height1 = __GMM_EXPAND_HEIGHT(this, Height >> 1, VAlign, pTexInfo);

            // QPitch = (h0 + h1 + 12j) * pitch
            BlockHeight = Height0 + Height1 + 12 * VAlign;
        }
        else // SURFACE_STATE: Surface Array Spacing: ARYSPC_LOD0
        {
            // QPitch = h0 * pitch
            BlockHeight                               = Height0;
            pTexInfo->Alignment.ArraySpacingSingleLod = true;
        }

        if(Compress)
        {
            BlockHeight /= CompressHeight;
        }
        else if(pTexInfo->Flags.Gpu.SeparateStencil)
        {
            BlockHeight /= 2;
        }

        // Compute total array height
        BlockHeight *= ExpandedArraySize;
    }
    else
    {
        BlockHeight = Get2DMipMapHeight(pTexInfo);
    }


    ///////////////////////////////////
    // Calculate Pitch
    ///////////////////////////////////

    AlignedWidth = __GMM_EXPAND_WIDTH(this, Width, HAlign, pTexInfo);

    // Calculate special pitch case of small dimensions where LOD1 + LOD2 widths are greater
    // than LOD0.  e.g. dimensions 4x4 and MinPitch == 1
    if(pTexInfo->MaxLod >= 2)
    {
        uint32_t AlignedWidthLod1, AlignedWidthLod2;

        AlignedWidthLod1 = __GMM_EXPAND_WIDTH(this, Width >> 1, HAlign, pTexInfo);
        AlignedWidthLod2 = __GMM_EXPAND_WIDTH(this, Width >> 2, HAlign, pTexInfo);

        AlignedWidth = GFX_MAX(AlignedWidth, AlignedWidthLod1 + AlignedWidthLod2);
    }

    if(Compress)
    {
        AlignedWidth /= CompressWidth;
    }
    else if(pTexInfo->Flags.Gpu.SeparateStencil)
    {
        AlignedWidth *= 2;
    }
    else if(pTexInfo->Flags.Gpu.ColorSeparation)
    {
        AlignedWidth *= pTexInfo->ArraySize;
        __GMM_ASSERT(0 == (AlignedWidth % GMM_COLOR_SEPARATION_WIDTH_DIVISION));
        AlignedWidth /= GMM_COLOR_SEPARATION_WIDTH_DIVISION;
    }
    else if(pTexInfo->Flags.Gpu.ColorSeparationRGBX)
    {
        AlignedWidth *= pTexInfo->ArraySize;
        __GMM_ASSERT(0 == (AlignedWidth % GMM_COLOR_SEPARATION_RGBX_WIDTH_DIVISION));
        AlignedWidth /= GMM_COLOR_SEPARATION_RGBX_WIDTH_DIVISION;
    }

    // Default pitch
    Pitch = AlignedWidth * BitsPerPixel >> 3;

    // Make sure the pitch satisfy linear min pitch requirment
    Pitch = GFX_MAX(Pitch, pRestrictions->MinPitch);

    // Make sure pitch satisfy alignment restriction
    Pitch = GFX_ALIGN(Pitch, pRestrictions->PitchAlignment);


    ////////////////////
    // Adjust for Tiling
    ////////////////////
    if(GMM_IS_TILED(pPlatform->TileInfo[pTexInfo->TileMode]))
    {
        Pitch       = GFX_ALIGN(Pitch, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileWidth);
        BlockHeight = GFX_ALIGN(BlockHeight, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight);

        // If Tiled Resource or Undefined64KBSwizzle resource, align to 64KB tile size
        if((pTexInfo->Flags.Gpu.TiledResource || pTexInfo->Flags.Info.Undefined64KBSwizzle) &&
           (pTexInfo->Flags.Info.TiledY))
        {
            uint32_t ColFactor = 0, RowFactor = 0;
            uint32_t TRTileWidth = 0, TRTileHeight = 0;

            GmmGetD3DToHwTileConversion(pTexInfo, &ColFactor, &RowFactor);
            TRTileWidth  = pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileWidth * ColFactor;
            TRTileHeight = pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight * RowFactor;

            Pitch       = GFX_ALIGN(Pitch, TRTileWidth);
            BlockHeight = GFX_ALIGN(BlockHeight, TRTileHeight);
        }
    }

    GMM_ASSERTDPF(pTexInfo->Flags.Info.LayoutBelow || !pTexInfo->Flags.Info.LayoutRight, "MIPLAYOUT_RIGHT not supported after Gen6!");
    pTexInfo->Flags.Info.LayoutBelow = 1;
    pTexInfo->Flags.Info.LayoutRight = 0;

    // If a texture is YUV packed, 96, or 48 bpp then one row plus 16 bytes of
    // padding needs to be added. Since this will create a none pitch aligned
    // surface the padding is aligned to the next row
    if(GmmIsYUVPacked(pTexInfo->Format) ||
       (pTexInfo->BitsPerPixel == GMM_BITS(96)) ||
       (pTexInfo->BitsPerPixel == GMM_BITS(48)))
    {
        BlockHeight += GMM_SCANLINES(1) + GFX_CEIL_DIV(GMM_BYTES(16), Pitch);
    }

    // Align height to even row to cover for HW over - fetch
    BlockHeight = GFX_ALIGN(BlockHeight, __GMM_EVEN_ROW);

    if((Status = // <-- Note assignment.
        FillTexPitchAndSize(
        pTexInfo, Pitch, BlockHeight, pRestrictions)) == GMM_SUCCESS)
    {
        Fill2DTexOffsetAddress(pTexInfo);

        // Init to no-packed mips. It'll be initialized when app calls to get packed
        // mips. Calculate packed mips here if there's a chance apps won't call to
        // get packed mips.
        pTexInfo->Alignment.PackedMipStartLod = GMM_TILED_RESOURCE_NO_PACKED_MIPS;
    }

    GMM_DPF_EXIT;
    return (Status);
}